

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

void __thiscall musicBlock::OPLreleaseNote(musicBlock *this,uint channel,uchar note)

{
  byte bVar1;
  uint sustain;
  uint id;
  uint i;
  uchar note_local;
  uint channel_local;
  musicBlock *this_local;
  
  bVar1 = (this->driverdata).channelSustain[channel];
  for (sustain = 0; sustain < this->io->OPLchannels; sustain = sustain + 1) {
    if ((this->channels[sustain].channel == channel) && (this->channels[sustain].note == note)) {
      if (bVar1 < 0x40) {
        releaseChannel(this,sustain,0);
      }
      else {
        this->channels[sustain].flags = this->channels[sustain].flags | 2;
      }
    }
  }
  return;
}

Assistant:

void musicBlock::OPLreleaseNote(uint channel, uchar note)
{
	uint i;
	uint id = channel;
	uint sustain = driverdata.channelSustain[channel];

	for(i = 0; i < io->OPLchannels; i++)
	{
		if (channels[i].channel == id && channels[i].note == note)
		{
			if (sustain < 0x40)
				releaseChannel(i, 0);
			else
				channels[i].flags |= CH_SUSTAIN;
		}
	}
}